

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise::ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffc0;
  
  Layer::Layer(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__ConvolutionDepthWise_001dfc88;
  Mat::Mat((Mat *)(in_RDI + 0x20));
  Mat::Mat((Mat *)(in_RDI + 0x28));
  Mat::Mat((Mat *)(in_RDI + 0x30));
  Mat::Mat((Mat *)(in_RDI + 0x38));
  Mat::Mat((Mat *)(in_RDI + 0x40));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x244) = 0;
  return;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;

    use_int8_requantize = false;
}